

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ConcatLayerParams * __thiscall
CoreML::Specification::ConcatLayerParams::New(ConcatLayerParams *this,Arena *arena)

{
  ConcatLayerParams *this_00;
  
  this_00 = (ConcatLayerParams *)operator_new(0x18);
  ConcatLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ConcatLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ConcatLayerParams* ConcatLayerParams::New(::google::protobuf::Arena* arena) const {
  ConcatLayerParams* n = new ConcatLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}